

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asyn-thread.c
# Opt level: O2

int getaddrinfo_complete(connectdata *conn)

{
  void *pvVar1;
  CURLcode CVar2;
  
  pvVar1 = (conn->async).os_specific;
  CVar2 = Curl_addrinfo_callback
                    (conn,*(int *)((long)pvVar1 + 0x34),*(Curl_addrinfo **)((long)pvVar1 + 0x38));
  *(undefined8 *)((long)pvVar1 + 0x38) = 0;
  return CVar2;
}

Assistant:

static int getaddrinfo_complete(struct connectdata *conn)
{
  struct thread_sync_data *tsd = conn_thread_sync_data(conn);
  int rc;

  rc = Curl_addrinfo_callback(conn, tsd->sock_error, tsd->res);
  /* The tsd->res structure has been copied to async.dns and perhaps the DNS
     cache.  Set our copy to NULL so destroy_thread_sync_data doesn't free it.
  */
  tsd->res = NULL;

  return rc;
}